

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

List<Kernel::Formula_*> ** array_new<Lib::List<Kernel::Formula*>*>(void *placement,size_t length)

{
  List<Kernel::Formula_*> **p;
  List<Kernel::Formula_*> **res;
  size_t length_local;
  void *placement_local;
  
  p = (List<Kernel::Formula_*> **)placement;
  length_local = length;
  while (length_local != 0) {
    *p = (List<Kernel::Formula_*> *)0x0;
    p = p + 1;
    length_local = length_local - 1;
  }
  return (List<Kernel::Formula_*> **)placement;
}

Assistant:

T* array_new(void* placement, size_t length)
{
  ASS_NEQ(placement,0);
  ASS_G(length,0);

  T* res=static_cast<T*>(placement);
  T* p=res;
  while(length--) {
    ::new(static_cast<void*>(p++)) T();
  }
  return res;
}